

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::splatI16x8(Literal *__return_storage_ptr__,Literal *this)

{
  undefined1 local_e0 [8];
  LaneArray<8> lanes;
  
  if ((this->type).id == 2) {
    memset((array<wasm::Literal,_8UL> *)local_e0,0,0xc0);
    std::array<wasm::Literal,_8UL>::fill((array<wasm::Literal,_8UL> *)local_e0,this);
    Literal(__return_storage_ptr__,(LaneArray<8> *)local_e0);
    std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)local_e0);
    return __return_storage_ptr__;
  }
  __assert_fail("val.type == Ty",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                ,0x683,"Literal wasm::splat(const Literal &) [Ty = wasm::Type::i32, Lanes = 8]");
}

Assistant:

Literal Literal::splatI16x8() const { return splat<Type::i32, 8>(*this); }